

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScroller::setScrollerProperties(QScroller *this,QScrollerProperties *sp)

{
  QScrollerProperties *this_00;
  QScrollerPrivate *this_01;
  bool bVar1;
  
  this_01 = this->d_ptr;
  this_00 = &this_01->properties;
  bVar1 = QScrollerProperties::operator!=(this_00,sp);
  if (bVar1) {
    QScrollerProperties::operator=(this_00,sp);
    scrollerPropertiesChanged(this,sp);
    QScrollerPrivate::recalcScrollingSegments(this_01,true);
    return;
  }
  return;
}

Assistant:

void QScroller::setScrollerProperties(const QScrollerProperties &sp)
{
    Q_D(QScroller);
    if (d->properties != sp) {
        d->properties = sp;
        emit scrollerPropertiesChanged(sp);

        // we need to force the recalculation here, since the overshootPolicy may have changed and
        // existing segments may include an overshoot animation.
        d->recalcScrollingSegments(true);
    }
}